

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxalloc.h
# Opt level: O3

void soplex::spx_alloc<soplex::SoPlexBase<double>::Settings*>(Settings **p,int n)

{
  Settings *pSVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  pSVar1 = (Settings *)malloc((ulong)(n + (uint)(n == 0)) * 0x168);
  *p = pSVar1;
  if (pSVar1 != (Settings *)0x0) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"EMALLC01 malloc: Out of memory - cannot allocate ",0x31);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes",6);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"XMALLC01 malloc: Could not allocate enough memory","");
  *puVar3 = &PTR__SPxException_0069d438;
  puVar3[1] = puVar3 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 1),local_40,local_40 + local_38);
  *puVar3 = &PTR__SPxException_0069d478;
  __cxa_throw(puVar3,&SPxMemoryException::typeinfo,SPxException::~SPxException);
}

Assistant:

inline void spx_alloc(T& p, int n = 1)
{
   assert(p == nullptr);
   assert(n >= 0);

   if(n == 0)
      n = 1;

   try
   {
      p = reinterpret_cast<T>(malloc(sizeof(*p) * (unsigned int) n));
   }
   catch(const std::bad_alloc&)
   {
      throw(SPxMemoryException("Error allocating memory"));
   }

   if(nullptr == p)
   {
      // coverity[suspicious_sizeof]
      std::cerr << "EMALLC01 malloc: Out of memory - cannot allocate "
                << sizeof(*p) * (unsigned int) n << " bytes" << std::endl;
      throw(SPxMemoryException("XMALLC01 malloc: Could not allocate enough memory"));
   }
}